

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O2

HighsDebugStatus __thiscall HEkk::debugBasisConsistent(HEkk *this)

{
  char cVar1;
  int iVar2;
  HighsOptions *pHVar3;
  HighsDebugStatus HVar4;
  char *format;
  HighsDebugStatus HVar5;
  HighsInt iRow;
  ulong uVar6;
  vector<signed_char,_std::allocator<signed_char>_> localNonbasicFlag;
  
  pHVar3 = this->options_;
  if ((pHVar3->super_HighsOptionsStruct).highs_debug_level < 1) {
    HVar5 = kNotChecked;
  }
  else {
    HVar4 = debugNonbasicFlagConsistent(this);
    HVar5 = kOk;
    if (HVar4 == kLogicalError) {
      highsLogDev(&(pHVar3->super_HighsOptionsStruct).log_options,kError,
                  "nonbasicFlag inconsistent\n");
      HVar5 = kLogicalError;
    }
    if ((this->lp_).num_row_ !=
        (int)((ulong)((long)(this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 2)) {
      highsLogDev(&(pHVar3->super_HighsOptionsStruct).log_options,kError,"basicIndex size error\n");
      HVar5 = kLogicalError;
    }
    std::vector<signed_char,_std::allocator<signed_char>_>::vector
              (&localNonbasicFlag,&(this->basis_).nonbasicFlag_);
    for (uVar6 = 0; (long)uVar6 < (long)(this->lp_).num_row_; uVar6 = uVar6 + 1) {
      iVar2 = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar6];
      cVar1 = localNonbasicFlag.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
              _M_impl.super__Vector_impl_data._M_start[iVar2];
      localNonbasicFlag.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[iVar2] = -1;
      if (cVar1 != '\0') {
        format = "Entry basicIndex_[%d] = %d is not basic\n";
        if (cVar1 != '\x01') {
          format = "Entry basicIndex_[%d] = %d is already basic\n";
        }
        highsLogDev(&(pHVar3->super_HighsOptionsStruct).log_options,kError,format,uVar6 & 0xffffffff
                   );
        HVar5 = kLogicalError;
      }
    }
    std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
              (&localNonbasicFlag.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
  }
  return HVar5;
}

Assistant:

HighsDebugStatus HEkk::debugBasisConsistent() const {
  // Cheap analysis of a Simplex basis, checking vector sizes, numbers
  // of basic/nonbasic variables and non-repetition of basic variables
  if (this->options_->highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  const HighsOptions& options = *(this->options_);
  const HighsLp& lp = this->lp_;
  const SimplexBasis& basis = this->basis_;
  // Check consistency of nonbasicFlag
  if (this->debugNonbasicFlagConsistent() == HighsDebugStatus::kLogicalError) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "nonbasicFlag inconsistent\n");
    return_status = HighsDebugStatus::kLogicalError;
  }
  const bool right_size = (HighsInt)basis.basicIndex_.size() == lp.num_row_;
  // Check consistency of basicIndex
  if (!right_size) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "basicIndex size error\n");
    assert(right_size);
    return_status = HighsDebugStatus::kLogicalError;
  }
  // Use localNonbasicFlag so that duplicate entries in basicIndex can
  // be spotted
  vector<int8_t> localNonbasicFlag = basis.nonbasicFlag_;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    HighsInt iCol = basis.basicIndex_[iRow];
    HighsInt flag = localNonbasicFlag[iCol];
    // Indicate that this column has been found in basicIndex
    localNonbasicFlag[iCol] = -1;
    if (flag) {
      // Nonzero value for localNonbasicFlag entry means that column is either
      if (flag == kNonbasicFlagTrue) {
        // Nonbasic...
        highsLogDev(options.log_options, HighsLogType::kError,
                    "Entry basicIndex_[%" HIGHSINT_FORMAT
                    "] = %" HIGHSINT_FORMAT " is not basic\n",
                    iRow, iCol);
      } else {
        // .. or is -1 since it has already been found in basicIndex
        highsLogDev(options.log_options, HighsLogType::kError,
                    "Entry basicIndex_[%" HIGHSINT_FORMAT
                    "] = %" HIGHSINT_FORMAT " is already basic\n",
                    iRow, iCol);
        assert(flag == -1);
      }
      assert(!flag);
      return_status = HighsDebugStatus::kLogicalError;
    }
  }
  return return_status;
}